

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitIteratorTopLevelFinally
               (ByteCodeLabel finallyLabel,RegSlot iteratorLocation,RegSlot shouldCallReturnLocation
               ,RegSlot yieldExceptionLocation,RegSlot yieldOffsetLocation,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,bool isAsync)

{
  ByteCodeWriter *this;
  bool bVar1;
  ByteCodeLabel labelID;
  ByteCodeLabel labelID_00;
  
  bVar1 = Js::FunctionProxy::IsCoroutine(&funcInfo->byteCodeFunction->super_FunctionProxy);
  this = &byteCodeGenerator->m_writer;
  labelID = Js::ByteCodeWriter::DefineLabel(this);
  Js::ByteCodeWriter::Empty(this,Leave);
  Js::ByteCodeWriter::RecordCrossFrameEntryExitRecord(this,false);
  Js::ByteCodeWriter::RecordCrossFrameEntryExitRecord(this,true);
  Js::ByteCodeWriter::Br(this,labelID);
  Js::ByteCodeWriter::MarkLabel(this,finallyLabel);
  Js::ByteCodeWriter::Empty(this,Finally);
  ByteCodeGenerator::PushJumpCleanupForTry
            (byteCodeGenerator,ResumeFinally,finallyLabel,yieldExceptionLocation,yieldOffsetLocation
            );
  labelID_00 = Js::ByteCodeWriter::DefineLabel(this);
  Js::ByteCodeWriter::BrReg1(this,BrFalse_A,labelID_00,shouldCallReturnLocation);
  EmitIteratorClose(iteratorLocation,byteCodeGenerator,funcInfo,isAsync);
  Js::ByteCodeWriter::MarkLabel(this,labelID_00);
  ByteCodeGenerator::PopJumpCleanup(byteCodeGenerator);
  if (bVar1) {
    FuncInfo::ReleaseTmpRegister(funcInfo,yieldOffsetLocation);
    FuncInfo::ReleaseTmpRegister(funcInfo,yieldExceptionLocation);
  }
  Js::ByteCodeWriter::RecordCrossFrameEntryExitRecord(this,false);
  Js::ByteCodeWriter::Empty(this,LeaveNull);
  Js::ByteCodeWriter::MarkLabel(this,labelID);
  return;
}

Assistant:

void EmitIteratorTopLevelFinally(
    Js::ByteCodeLabel finallyLabel,
    Js::RegSlot iteratorLocation,
    Js::RegSlot shouldCallReturnLocation,
    Js::RegSlot yieldExceptionLocation,
    Js::RegSlot yieldOffsetLocation,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo,
    bool isAsync)
{
    bool isCoroutine = funcInfo->byteCodeFunction->IsCoroutine();

    Js::ByteCodeLabel afterFinallyBlockLabel = byteCodeGenerator->Writer()->DefineLabel();
    byteCodeGenerator->Writer()->Empty(Js::OpCode::Leave);

    byteCodeGenerator->Writer()->RecordCrossFrameEntryExitRecord(false);
    byteCodeGenerator->Writer()->RecordCrossFrameEntryExitRecord(true);

    byteCodeGenerator->Writer()->Br(afterFinallyBlockLabel);
    byteCodeGenerator->Writer()->MarkLabel(finallyLabel);
    byteCodeGenerator->Writer()->Empty(Js::OpCode::Finally);

    byteCodeGenerator->PushJumpCleanupForTry(
        Js::OpCode::ResumeFinally,
        finallyLabel,
        yieldExceptionLocation,
        yieldOffsetLocation);

    Js::ByteCodeLabel skipCallCloseLabel = byteCodeGenerator->Writer()->DefineLabel();

    byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrFalse_A, skipCallCloseLabel, shouldCallReturnLocation);
    EmitIteratorClose(iteratorLocation, byteCodeGenerator, funcInfo, isAsync);

    byteCodeGenerator->Writer()->MarkLabel(skipCallCloseLabel);

    byteCodeGenerator->PopJumpCleanup();
    if (isCoroutine)
    {
        funcInfo->ReleaseTmpRegister(yieldOffsetLocation);
        funcInfo->ReleaseTmpRegister(yieldExceptionLocation);
    }

    byteCodeGenerator->Writer()->RecordCrossFrameEntryExitRecord(false);
    byteCodeGenerator->Writer()->Empty(Js::OpCode::LeaveNull);
    byteCodeGenerator->Writer()->MarkLabel(afterFinallyBlockLabel);
}